

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::IsTeammate(AActor *this,AActor *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if (other != (AActor *)0x0) {
    if (((deathmatch.Value != 0) || (this->player == (player_t *)0x0)) ||
       (bVar1 = true, other->player == (player_t *)0x0)) {
      if (teamplay.Value) {
        iVar2 = GetTeam(this);
        iVar3 = GetTeam(other);
        bVar1 = iVar2 == iVar3 && iVar2 != 0xff;
      }
      else {
        bVar1 = false;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool AActor::IsTeammate (AActor *other)
{
	if (!other)
	{
		return false;
	}
	else if (!deathmatch && player && other->player)
	{
		return true;
	}
	else if (teamplay)
	{
		int myTeam = GetTeam();
		int otherTeam = other->GetTeam();

		return (myTeam != TEAM_NONE && myTeam == otherTeam);
	}
	return false;
}